

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O3

XMLCh * __thiscall xercesc_4_0::DOMNormalizer::integerToXMLCh(DOMNormalizer *this,uint i)

{
  short *psVar1;
  ushort uVar2;
  DOMDocumentImpl *pDVar3;
  bool bVar4;
  long lVar5;
  ushort *puVar6;
  int iVar7;
  undefined4 extraout_var;
  ulong uVar9;
  long lVar10;
  DOMStringPoolEntry *pDVar11;
  ushort *puVar12;
  uint uVar13;
  DOMStringPoolEntry *pDVar14;
  XMLCh *target;
  XMLSize_t XVar15;
  long lVar8;
  undefined4 extraout_var_00;
  
  iVar7 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,0x1e);
  lVar8 = CONCAT44(extraout_var,iVar7);
  *(undefined2 *)(lVar8 + 0xc) = 0;
  puVar6 = (ushort *)(lVar8 + 0x10);
  do {
    puVar12 = puVar6;
    uVar13 = i % 10 | 0x30;
    uVar9 = (ulong)uVar13;
    puVar12[-3] = (ushort)uVar13;
    bVar4 = 9 < i;
    puVar6 = puVar12 + -1;
    i = i / 10;
  } while (bVar4);
  pDVar3 = this->fDocument;
  lVar10 = 0;
  do {
    lVar5 = lVar10 + -6;
    lVar10 = lVar10 + 2;
  } while (*(short *)((long)puVar12 + lVar5) != 0);
  uVar2 = puVar12[-2];
  while (uVar2 != 0) {
    uVar9 = (ulong)uVar2 + (uVar9 >> 0x18) + uVar9 * 0x26;
    uVar2 = *puVar6;
    puVar6 = puVar6 + 1;
  }
  XVar15 = (lVar10 >> 1) - 1;
  uVar9 = uVar9 % pDVar3->fNameTableSize;
  pDVar11 = pDVar3->fNameTable[uVar9];
  if (pDVar11 == (DOMStringPoolEntry *)0x0) {
    pDVar14 = (DOMStringPoolEntry *)(pDVar3->fNameTable + uVar9);
  }
  else {
    do {
      pDVar14 = pDVar11;
      if (pDVar14->fLength == XVar15) {
        target = pDVar14->fString;
        if ((XMLCh *)(puVar12 + -3) == target) goto LAB_002750b3;
        lVar10 = 0;
        do {
          psVar1 = (short *)((long)target + lVar10);
          if (*psVar1 == 0) {
            if (*(short *)((long)puVar12 + lVar10 + -6) == 0) goto LAB_002750b3;
            break;
          }
          lVar5 = lVar10 + -6;
          lVar10 = lVar10 + 2;
        } while (*psVar1 == *(short *)((long)puVar12 + lVar5));
      }
      pDVar11 = pDVar14->fNext;
    } while (pDVar14->fNext != (DOMStringPoolEntry *)0x0);
  }
  iVar7 = (*(pDVar3->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(pDVar3,XVar15 * 2 + 0x18);
  pDVar11 = (DOMStringPoolEntry *)CONCAT44(extraout_var_00,iVar7);
  pDVar14->fNext = pDVar11;
  pDVar11->fLength = XVar15;
  pDVar11->fNext = (DOMStringPoolEntry *)0x0;
  target = pDVar11->fString;
  XMLString::copyString(target,(XMLCh *)(puVar12 + -3));
LAB_002750b3:
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,lVar8);
  return target;
}

Assistant:

const XMLCh * DOMNormalizer::integerToXMLCh(unsigned int i) const {
    XMLCh *buf = (XMLCh*) fMemoryManager->allocate(15 * sizeof(XMLCh));//new XMLCh[15];
	XMLCh *pos = buf + sizeof(buf) - sizeof(XMLCh);
	*pos = chNull;

	do {
        switch(i % 10) {
        case 0 : *--pos = chDigit_0;break;
        case 1 : *--pos = chDigit_1;break;
        case 2 : *--pos = chDigit_2;break;
        case 3 : *--pos = chDigit_3;break;
        case 4 : *--pos = chDigit_4;break;
        case 5 : *--pos = chDigit_5;break;
        case 6 : *--pos = chDigit_6;break;
        case 7 : *--pos = chDigit_7;break;
        case 8 : *--pos = chDigit_8;break;
        case 9 : *--pos = chDigit_9;break;
        default:;
        }
		i /= 10;
	} while (i);

    const XMLCh *copy = fDocument->getPooledString(pos);
    fMemoryManager->deallocate(buf);//delete[] buf;
	return copy;
}